

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O0

ClausePtr __thiscall Satyricon::SATSolver::propagation(SATSolver *this)

{
  ulong uVar1;
  __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
  __first;
  uint64_t uVar2;
  bool bVar3;
  literal_value lVar4;
  size_type sVar5;
  ostream *poVar6;
  reference pvVar7;
  char *pcVar8;
  reference pvVar9;
  pointer pWVar10;
  Literal *pLVar11;
  reference pWVar12;
  uint64_t uVar13;
  Literal *pLVar14;
  ClausePtr pCVar15;
  __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
  *p_Var16;
  iterator __last;
  back_insert_iterator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
  __result;
  int __c;
  int __c_00;
  int extraout_EDX;
  int __c_01;
  int extraout_EDX_00;
  int __c_02;
  int __c_03;
  code *__s;
  bool local_d1;
  ClausePtr conflict_clause;
  string local_70;
  Literal local_50;
  undefined1 local_49;
  uint64_t uStack_48;
  bool conflict;
  size_t pos;
  ClausePtr pCStack_38;
  bool foundt_new_watch;
  Clause *c;
  __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
  local_28;
  iterator it;
  Literal failed;
  SATSolver *this_local;
  
  do {
    uVar1 = this->propagation_starting_pos;
    sVar5 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size(&this->trail)
    ;
    if (sVar5 <= uVar1) {
      return (ClausePtr)0x0;
    }
    if (1 < this->log_level) {
      poVar6 = std::operator<<((ostream *)&std::cout,"propagate ");
      pvVar7 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                         (&this->trail,this->propagation_starting_pos);
      poVar6 = operator<<(poVar6,pvVar7);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    pcVar8 = (char *)this->propagation_starting_pos;
    this->propagation_starting_pos = (size_type)(pcVar8 + 1);
    pvVar7 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                       (&this->trail,(size_type)pcVar8);
    it._M_current._4_4_ = Literal::operator!(pvVar7);
    std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
    clear(&this->propagation_to_move);
    pcVar8 = Literal::index((Literal *)((long)&it._M_current + 4),pcVar8,__c);
    pvVar9 = std::
             vector<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
             ::operator[](&this->watch_list,(ulong)pcVar8 & 0xffffffff);
    std::swap<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>
              (&this->propagation_to_move,pvVar9);
    local_28._M_current =
         (Watcher *)
         std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
         ::begin(&this->propagation_to_move);
    while( true ) {
      c = (Clause *)
          std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
          ::end(&this->propagation_to_move);
      bVar3 = __gnu_cxx::operator!=
                        (&local_28,
                         (__normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
                          *)&c);
      if (!bVar3) break;
      pWVar10 = __gnu_cxx::
                __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
                ::operator->(&local_28);
      pCStack_38 = Watcher::get_clause(pWVar10);
      pLVar11 = Clause::operator[](pCStack_38,0);
      bVar3 = Literal::operator==(pLVar11,(Literal *)((long)&it._M_current + 4));
      local_d1 = true;
      if (!bVar3) {
        pLVar11 = Clause::operator[](pCStack_38,1);
        local_d1 = Literal::operator==(pLVar11,(Literal *)((long)&it._M_current + 4));
      }
      if (local_d1 == false) {
        __assert_fail("c[0]==failed || c[1]==failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/src/sat_solver.cpp"
                      ,0x14f,"SATSolver::ClausePtr Satyricon::SATSolver::propagation()");
      }
      pLVar11 = Clause::operator[](pCStack_38,0);
      bVar3 = Literal::operator==(pLVar11,(Literal *)((long)&it._M_current + 4));
      if (bVar3) {
        pLVar11 = Clause::operator[](pCStack_38,1);
        pLVar14 = Clause::operator[](pCStack_38,0);
        pLVar14->value = pLVar11->value;
        pLVar11 = Clause::operator[](pCStack_38,1);
        pLVar11->value = it._M_current._4_4_;
      }
      pWVar12 = (reference)Clause::operator[](pCStack_38,0);
      lVar4 = get_asigned_value(this,(Literal *)pWVar12);
      if (lVar4 == LIT_TRUE) {
        pcVar8 = Literal::index((Literal *)((long)&it._M_current + 4),(char *)pWVar12,__c_00);
        pvVar9 = std::
                 vector<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                 ::operator[](&this->watch_list,(ulong)pcVar8 & 0xffffffff);
        pWVar12 = __gnu_cxx::
                  __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
                  ::operator*(&local_28);
        std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
        push_back(pvVar9,pWVar12);
      }
      else {
        pos._7_1_ = 0;
        for (uStack_48 = 2; uVar2 = uStack_48, uVar13 = Clause::size(pCStack_38),
            __c_02 = extraout_EDX, uVar2 != uVar13; uStack_48 = uStack_48 + 1) {
          pWVar12 = (reference)Clause::operator[](pCStack_38,uStack_48);
          lVar4 = get_asigned_value(this,(Literal *)pWVar12);
          if (lVar4 != LIT_FALSE) {
            pLVar11 = Clause::operator[](pCStack_38,uStack_48);
            pLVar14 = Clause::operator[](pCStack_38,1);
            pLVar14->value = pLVar11->value;
            pLVar11 = Clause::operator[](pCStack_38,uStack_48);
            pLVar11->value = it._M_current._4_4_;
            pcVar8 = (char *)0x1;
            pLVar11 = Clause::operator[](pCStack_38,1);
            pcVar8 = Literal::index(pLVar11,pcVar8,__c_01);
            pvVar9 = std::
                     vector<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                     ::operator[](&this->watch_list,(ulong)pcVar8 & 0xffffffff);
            pWVar12 = __gnu_cxx::
                      __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
                      ::operator*(&local_28);
            std::
            vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
            push_back(pvVar9,pWVar12);
            pos._7_1_ = 1;
            __c_02 = extraout_EDX_00;
            break;
          }
        }
        if ((pos._7_1_ & 1) == 0) {
          pcVar8 = Literal::index((Literal *)((long)&it._M_current + 4),(char *)pWVar12,__c_02);
          pvVar9 = std::
                   vector<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                   ::operator[](&this->watch_list,(ulong)pcVar8 & 0xffffffff);
          pWVar12 = __gnu_cxx::
                    __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
                    ::operator*(&local_28);
          std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
          ::push_back(pvVar9,pWVar12);
          pLVar11 = Clause::operator[](pCStack_38,0);
          local_50.value = pLVar11->value;
          pWVar10 = __gnu_cxx::
                    __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
                    ::operator->(&local_28);
          pCVar15 = Watcher::get_clause(pWVar10);
          __s = (code *)(ulong)(uint)local_50.value;
          local_49 = assign(this,local_50,pCVar15);
          if ((bool)local_49) {
            if (1 < this->log_level) {
              poVar6 = std::operator<<((ostream *)&std::cout,"\tfound a conflict on ");
              pWVar10 = __gnu_cxx::
                        __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
                        ::operator->(&local_28);
              pCVar15 = Watcher::get_clause(pWVar10);
              Clause::print_abi_cxx11_(&local_70,pCVar15);
              poVar6 = std::operator<<(poVar6,(string *)&local_70);
              __s = std::endl<char,std::char_traits<char>>;
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)&local_70);
            }
            pWVar10 = __gnu_cxx::
                      __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
                      ::operator->(&local_28);
            pCVar15 = Watcher::get_clause(pWVar10);
            p_Var16 = __gnu_cxx::
                      __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
                      ::operator++(&local_28);
            __first._M_current = p_Var16->_M_current;
            __last = std::
                     vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                     ::end(&this->propagation_to_move);
            pcVar8 = Literal::index((Literal *)((long)&it._M_current + 4),(char *)__s,__c_03);
            pvVar9 = std::
                     vector<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                     ::operator[](&this->watch_list,(ulong)pcVar8 & 0xffffffff);
            __result = std::
                       back_inserter<std::vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>>
                                 (pvVar9);
            std::
            copy<__gnu_cxx::__normal_iterator<Satyricon::SATSolver::Watcher*,std::vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>>,std::back_insert_iterator<std::vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>>>
                      (__first,(__normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
                                )__last._M_current,__result);
            return pCVar15;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
      ::operator++(&local_28);
    }
  } while( true );
}

Assistant:

SATSolver::ClausePtr SATSolver::propagation() {

    while ( propagation_starting_pos < trail.size() ) {

        PRINT_VERBOSE("propagate " << trail[propagation_starting_pos] << endl);

        // extract the list of the opposite literal 
        // (they are false now, their watcher must be moved)
        auto failed = !trail[propagation_starting_pos++];
        propagation_to_move.clear();
        swap(propagation_to_move,watch_list[failed.index()]);

        for (auto it = propagation_to_move.begin();
                it != propagation_to_move.end(); ++it) {

            // propagate effect on a clause
            Clause &c = *(it->get_clause()); // usefull reference
            assert(c[0]==failed || c[1]==failed);

            // make sure the false literal is in position 1
            if ( c[0] == failed ) { c[0] = c[1]; c[1] = failed; }

            // if the clause is already solved, nothing need to be moved
            if (get_asigned_value(c[0]) == LIT_TRUE) {
                // reinsert inside the previous watch list
                watch_list[failed.index()].push_back(*it);
                continue; // move to the next
            }

            // search a new literal to watch
            bool foundt_new_watch = false;
            for ( size_t pos = 2; pos != c.size(); ++pos) {
                if ( get_asigned_value(c[pos]) != LIT_FALSE ) {
                    // swap value
                    c[1] = c[pos]; c[pos] = failed;
                    // insert in the new watch list
                    watch_list[c[1].index()].push_back(*it);
                    // move to the next
                    foundt_new_watch = true;
                    break;
                }
            }
            if ( foundt_new_watch ) continue; // move to the next

            // no new literal to watch, reinsert in the old position
            watch_list[failed.index()].push_back(*it);

            // the clause must be a conflict or a unit, try to assign the value
            bool conflict = assign(c[0],it->get_clause());
            if ( ! conflict ) continue; // no problem, move to the next

            // conflict found in propagation 
            PRINT_VERBOSE("\tfound a conflict on " << (it->get_clause())->print() << endl);
            ClausePtr conflict_clause = it->get_clause();

            // reset the other literal to move (it is already set by propagate)
            copy(++it, propagation_to_move.end(),
                    back_inserter(watch_list[failed.index()]));

            return conflict_clause;
        }
    }
    return nullptr; // no conflict
}